

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pce.c
# Opt level: O2

void pce_incbat(int *ip)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  byte *pbVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int h;
  int w;
  int local_58;
  int local_54;
  int y;
  int x;
  long local_48;
  uchar *local_40;
  ulong local_38;
  
  labldef(loccnt,1);
  if (pass == 1) {
    loadlc(loccnt,0);
  }
  iVar3 = pcx_get_args(ip);
  if (iVar3 != 0) {
    iVar3 = pcx_parse_args(1,pcx_nb_args + -1,&x,&y,&w,&h,8);
    if (iVar3 != 0) {
      if (pass == 1) {
        uVar4 = pcx_arg[0] >> 4;
        local_48 = (long)y;
        uVar8 = 0;
        local_58 = w;
        uVar9 = 0;
        if (0 < w) {
          uVar9 = (ulong)(uint)w;
        }
        local_54 = h;
        local_38 = 0;
        if (0 < h) {
          local_38 = (ulong)(uint)h;
        }
        local_40 = pcx_buf + x;
        lVar10 = (long)pcx_w;
        iVar3 = 0;
        bVar2 = false;
        for (; uVar8 != local_38; uVar8 = uVar8 + 1) {
          for (uVar11 = 0; uVar11 != uVar9; uVar11 = uVar11 + 1) {
            pbVar7 = local_40 + uVar11 * 8 + (local_48 + uVar8 * 8) * lVar10;
            bVar1 = *pbVar7;
            for (iVar6 = 0; iVar6 != 8; iVar6 = iVar6 + 1) {
              for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
                if (0xf < (pbVar7[lVar5] ^ bVar1)) {
                  bVar2 = true;
                }
              }
              pbVar7 = pbVar7 + lVar10;
            }
            buffer[(uint)(iVar3 * 2)] = (uchar)uVar4;
            buffer[(ulong)(uint)(iVar3 * 2) + 1] = (byte)(uVar4 >> 8) & 0xf | bVar1 & 0xf0;
            iVar3 = iVar3 + 1;
            uVar4 = uVar4 + 1;
          }
        }
        if (bVar2) {
          error("Invalid color index found!");
        }
      }
      putbuffer(buffer,h * w * 2);
      if (pass == 1) {
        println();
      }
    }
  }
  return;
}

Assistant:

void
pce_incbat(int *ip)
{
	unsigned char *ptr, ref;
	int i, j, k, l, x, y, w, h;
	unsigned int base, index, flag;
	unsigned int temp;

	/* define label */
	labldef(loccnt, 1);

	/* output */
	if (pass == LAST_PASS)
		loadlc(loccnt, 0);

	/* get args */
	if (!pcx_get_args(ip))
		return;
	if (!pcx_parse_args(1, pcx_nb_args - 1, &x, &y, &w, &h, 8))
		return;

	/* build the BAT */
	if (pass == LAST_PASS) {
		index = 0;
		flag  = 0;
		base  = (pcx_arg[0] >> 4);

		for (i = 0; i < h; i++) {
			for (j = 0; j < w; j++) {
				ptr = pcx_buf + (x + (j * 8)) + ((y + (i * 8)) * pcx_w);
				ref = ptr[0] & 0xF0;

				/* check colors */
				for (k = 0; k < 8; k++) {
					for (l = 0; l < 8; l++) {
						if ((ptr[l] & 0xF0) != ref)
							flag = 1;
					}				
					ptr += pcx_w;
				}
				temp = (base & 0xFFF) | ((ref & 0xF0) << 8);
				buffer[2*index]   = temp & 0xff;
				buffer[2*index+1] = temp >> 8;

				index++;
				base++;
			}
		}

		/* errors */
		if (flag)
			error("Invalid color index found!");
	}

	/* store data */
	putbuffer(buffer, 2 * w * h);

	/* output */
	if (pass == LAST_PASS)
		println();
}